

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uutils.c
# Opt level: O2

LispPTR unix_username(LispPTR *args)

{
  __uid_t __uid;
  int iVar1;
  LispPTR LVar2;
  passwd *ppVar3;
  
  __uid = getuid();
  ppVar3 = getpwuid(__uid);
  if (ppVar3 == (passwd *)0x0) {
    LVar2 = 0;
  }
  else {
    iVar1 = c_string_to_lisp_string(ppVar3->pw_name,*args);
    LVar2 = 0x4c;
    if (iVar1 != 0) {
      LVar2 = 0;
    }
  }
  return LVar2;
}

Assistant:

LispPTR unix_username(LispPTR *args) {
#ifndef DOS
  struct passwd *pwd;

  if ((pwd = getpwuid(getuid())) == NULL) return NIL;
  if (c_string_to_lisp_string(pwd->pw_name, args[0])) return NIL;
#endif /* DOS */
  return ATOM_T;
}